

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

bool ImGui::BeginPopupContextItem(char *str_id,int mouse_button)

{
  bool bVar1;
  
  if ((GImGui->CurrentWindow->DC).LastItemHoveredAndUsable == true) {
    bVar1 = IsMouseClicked(mouse_button,false);
    if (bVar1) {
      OpenPopupEx(str_id,false);
    }
  }
  bVar1 = BeginPopup(str_id);
  return bVar1;
}

Assistant:

bool ImGui::BeginPopupContextItem(const char* str_id, int mouse_button)
{
    if (IsItemHovered() && IsMouseClicked(mouse_button))
        OpenPopupEx(str_id, false);
    return BeginPopup(str_id);
}